

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::shl(SVInt *this,bitwidth_t amount)

{
  bool bVar1;
  uint bits;
  uint64_t *src;
  uint64_t *dst;
  byte bVar2;
  bool bVar3;
  uint in_EDX;
  undefined8 extraout_RDX;
  uint64_t value;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  SVIntStorage *other;
  ulong uVar5;
  ulong uVar6;
  uint32_t numWords;
  uint numWords_00;
  int iVar7;
  SVInt SVar8;
  
  other = (SVIntStorage *)CONCAT44(in_register_00000034,amount);
  if (in_EDX == 0) {
    SVInt(this,other);
    uVar4 = extraout_RDX;
  }
  else {
    bits = other->bitWidth;
    if (in_EDX < bits) {
      bVar3 = other->unknownFlag;
      bVar2 = (byte)in_EDX;
      if (0x40 < bits || (bVar3 & 1U) != 0) {
        bVar1 = other->signFlag;
        numWords_00 = bits + 0x3f >> 6;
        dst = (uint64_t *)operator_new__((ulong)((numWords_00 << (bVar3 & 0x1fU)) << 3));
        (this->super_SVIntStorage).field_0.pVal = dst;
        (this->super_SVIntStorage).bitWidth = bits;
        (this->super_SVIntStorage).signFlag = bVar1;
        (this->super_SVIntStorage).unknownFlag = bVar3;
        if (in_EDX < 0x40 && (bVar3 & 1U) == 0) {
          if (0x3f < bits + 0x3f) {
            iVar7 = numWords_00 << (bVar3 & 0x1fU);
            uVar5 = 0;
            uVar6 = 0;
            do {
              (this->super_SVIntStorage).field_0.pVal[uVar5] =
                   (other->field_0).pVal[uVar5] << (bVar2 & 0x3f) | uVar6;
              uVar6 = (other->field_0).pVal[uVar5] >> (0x40 - bVar2 & 0x3f);
              uVar5 = uVar5 + 1;
            } while (iVar7 + (uint)(iVar7 == 0) != uVar5);
          }
        }
        else {
          src = (other->field_0).pVal;
          shlFar(dst,src,in_EDX & 0x3f,in_EDX >> 6,0,numWords_00);
          if ((bVar3 & 1U) != 0) {
            shlFar(dst,src,in_EDX & 0x3f,in_EDX >> 6,numWords_00,numWords_00);
          }
        }
        clearUnusedBits(this);
        checkUnknown(this);
        uVar4 = extraout_RDX_01;
        goto LAB_0022924f;
      }
      value = (other->field_0).val << (bVar2 & 0x3f);
      bVar3 = other->signFlag;
    }
    else {
      bVar3 = other->signFlag;
      value = 0;
    }
    SVInt(this,bits,value,bVar3);
    uVar4 = extraout_RDX_00;
  }
LAB_0022924f:
  SVar8.super_SVIntStorage.bitWidth = (int)uVar4;
  SVar8.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar4 >> 0x20);
  SVar8.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar4 >> 0x28);
  SVar8.super_SVIntStorage._14_2_ = (short)((ulong)uVar4 >> 0x30);
  SVar8.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar8.super_SVIntStorage;
}

Assistant:

SVInt SVInt::shl(bitwidth_t amount) const {
    // handle trivial cases
    if (amount == 0)
        return *this;
    if (amount >= bitWidth) // if the shift amount is too large, we end up with zero anyway
        return SVInt(bitWidth, 0, signFlag);
    if (isSingleWord())
        return SVInt(bitWidth, val << amount, signFlag);

    // handle the small shift case
    SVInt result = allocUninitialized(bitWidth, signFlag, unknownFlag);
    if (amount < BITS_PER_WORD && !unknownFlag) {
        uint64_t carry = 0;
        for (uint32_t i = 0; i < getNumWords(); i++) {
            result.pVal[i] = pVal[i] << amount | carry;
            carry = pVal[i] >> (BITS_PER_WORD - amount);
        }
    }
    else {
        // otherwise do a full shift
        uint32_t numWords = getNumWords(bitWidth, false);
        uint32_t wordShift = amount % BITS_PER_WORD;
        uint32_t offset = amount / BITS_PER_WORD;

        // also handle shifting the unknown bits if necessary
        shlFar(result.pVal, pVal, wordShift, offset, 0, numWords);
        if (unknownFlag)
            shlFar(result.pVal, pVal, wordShift, offset, numWords, numWords);
    }

    result.clearUnusedBits();
    result.checkUnknown();
    return result;
}